

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraExec_cpp.h
# Opt level: O3

void __thiscall
moira::Moira::execMove0<(moira::Instr)71,(moira::Mode)2,(moira::Size)1>(Moira *this,u16 opcode)

{
  byte in_AL;
  bool bVar1;
  u32 uVar2;
  u32 data;
  u32 ea;
  byte local_18 [4];
  u32 local_14;
  
  local_18[0] = in_AL;
  bVar1 = readOp<(moira::Mode)2,(moira::Size)1,0ul>(this,opcode & 7,&local_14,(u32 *)local_18);
  if (bVar1) {
    (this->reg).sr.n = (bool)(local_18[0] >> 7);
    (this->reg).sr.z = local_18[0] == 0;
    (this->reg).sr.v = false;
    (this->reg).sr.c = false;
    *(byte *)((long)this->exec + (ulong)(opcode >> 9 & 7) * 4 + -0x58) = local_18[0];
    uVar2 = (this->reg).pc;
    (this->reg).pc0 = uVar2;
    (this->queue).ird = (this->queue).irc;
    uVar2 = readM<(moira::MemSpace)2,(moira::Size)2,4ul>(this,uVar2 + 2);
    (this->queue).irc = (u16)uVar2;
  }
  return;
}

Assistant:

void
Moira::execMove0(u16 opcode)
{
    u32 ea, data;

    int src = _____________xxx(opcode);
    int dst = ____xxx_________(opcode);

    if (!readOp <M, S, STD_AE_FRAME> (src, ea, data)) return;

    reg.sr.n = NBIT<S>(data);
    reg.sr.z = ZERO<S>(data);
    reg.sr.v = 0;
    reg.sr.c = 0;

    if (!writeOp <MODE_DN, S> (dst, data)) return;

    prefetch<POLLIPL>();
}